

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

int map_fill_point(dw_map *map,uint8_t **points,uint8_t x,uint8_t y,dw_tile tile)

{
  int iVar1;
  byte *pbVar2;
  
  iVar1 = 0;
  if (y < 0x78 && x < 0x78) {
    pbVar2 = *points;
    while (*pbVar2 < 0x79) {
      *points = pbVar2 + 2;
      pbVar2 = pbVar2 + 2;
    }
    *pbVar2 = x;
    (*points)[1] = y;
    map->tiles[y][x] = (uint8_t)tile;
    iVar1 = (tile == TILE_MOUNTAIN) + 1;
  }
  return iVar1;
}

Assistant:

static int map_fill_point(dw_map *map, uint8_t **points,
        uint8_t x, uint8_t y, dw_tile tile)
{
    if (x >= 120 || y >= 120)
        return 0;

    for (;;) {
        if ((*points)[0] > 120) { break; }
//        if (p[0] == x && p[1] == y) return 0;
        (*points) += 2;
    }
    (*points)[0] = x;
    (*points)[1] = y;
    map->tiles[y][x] = (uint8_t)tile;
    if (tile == TILE_MOUNTAIN)
        return 2; /* not so many mountain tiles */
    return 1;
}